

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

Abc_Obj_t * Abc_SclAddOneInv(Bus_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vFanouts,float Gain)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  Vec_Flt_t *pVVar7;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  int iVar8;
  Abc_Obj_t *pFanin;
  float *pfVar9;
  SC_Cell *pSVar10;
  char *__function;
  int Fill;
  char *__file;
  char *__assertion;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  if (0 < (p->pInv->vPins).nSize) {
    pvVar4 = *(p->pInv->vPins).pArray;
    fVar16 = *(float *)((long)pvVar4 + 0x10);
    fVar1 = *(float *)((long)pvVar4 + 0x14);
    uVar2 = p->pPars->nDegree;
    uVar11 = vFanouts->nSize;
    if ((int)uVar2 < vFanouts->nSize) {
      uVar11 = uVar2;
    }
    Bus_SclCheckSortedFanout(vFanouts);
    uVar13 = 0;
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar12 = uVar13;
    }
    fVar17 = 0.0;
    do {
      if (uVar12 == uVar13) goto LAB_00457272;
      if ((long)vFanouts->nSize <= (long)uVar13) goto LAB_004576d4;
      plVar5 = (long *)vFanouts->pArray[uVar13];
      fVar14 = Abc_SclFindWireLoad(p->vWireCaps,(int)uVar13);
      fVar15 = Abc_SclFindWireLoad(p->vWireCaps,(int)uVar13 + 1);
      iVar8 = (int)plVar5[2];
      if (((long)iVar8 < 0) ||
         (lVar6 = *(long *)(*(long *)(*plVar5 + 0x168) + 0x38), *(int *)(lVar6 + 4) <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar17 = fVar17 + fVar15 + (*(float *)(*(long *)(lVar6 + 8) + (long)iVar8 * 4) - fVar14);
      uVar13 = uVar13 + 1;
    } while (fVar17 <= (fVar16 * 0.5 + fVar1 * 0.5) * Gain);
    uVar12 = uVar13 & 0xffffffff;
LAB_00457272:
    if (p->pPars->fAddBufs == 0) {
      pFanin = Abc_NtkCreateNodeInv(p->pNtk,(Abc_Obj_t *)0x0);
    }
    else {
      pFanin = Abc_NtkCreateNodeBuf(p->pNtk,(Abc_Obj_t *)0x0);
    }
    pVVar7 = p->vCins;
    if (pFanin->Id != pVVar7->nSize) {
      __assert_fail("(int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                    ,0x170,
                    "Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)");
    }
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc(0x40);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,0x40);
        }
        pVVar7->pArray = pfVar9;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar2 * 2;
        if (iVar8 <= (int)uVar2) goto LAB_0045732f;
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc((ulong)uVar2 << 3);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,(ulong)uVar2 << 3);
        }
        pVVar7->pArray = pfVar9;
      }
      pVVar7->nCap = iVar8;
    }
LAB_0045732f:
    iVar8 = pVVar7->nSize;
    pVVar7->nSize = iVar8 + 1;
    pVVar7->pArray[iVar8] = 0.0;
    pVVar7 = p->vETimes;
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc(0x40);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,0x40);
        }
        pVVar7->pArray = pfVar9;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar2 * 2;
        if (iVar8 <= (int)uVar2) goto LAB_004573c0;
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc((ulong)uVar2 << 3);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,(ulong)uVar2 << 3);
        }
        pVVar7->pArray = pfVar9;
      }
      pVVar7->nCap = iVar8;
    }
LAB_004573c0:
    iVar8 = pVVar7->nSize;
    pVVar7->nSize = iVar8 + 1;
    pVVar7->pArray[iVar8] = 0.0;
    pVVar7 = p->vLoads;
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc(0x40);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,0x40);
        }
        pVVar7->pArray = pfVar9;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar2 * 2;
        if (iVar8 <= (int)uVar2) goto LAB_00457451;
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc((ulong)uVar2 << 3);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,(ulong)uVar2 << 3);
        }
        pVVar7->pArray = pfVar9;
      }
      pVVar7->nCap = iVar8;
    }
LAB_00457451:
    iVar8 = pVVar7->nSize;
    pVVar7->nSize = iVar8 + 1;
    pVVar7->pArray[iVar8] = 0.0;
    pVVar7 = p->vDepts;
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc(0x40);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,0x40);
        }
        pVVar7->pArray = pfVar9;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar2 * 2;
        if (iVar8 <= (int)uVar2) goto LAB_004574e2;
        if (pVVar7->pArray == (float *)0x0) {
          pfVar9 = (float *)malloc((ulong)uVar2 << 3);
        }
        else {
          pfVar9 = (float *)realloc(pVVar7->pArray,(ulong)uVar2 << 3);
        }
        pVVar7->pArray = pfVar9;
      }
      pVVar7->nCap = iVar8;
    }
LAB_004574e2:
    iVar8 = pVVar7->nSize;
    pVVar7->nSize = iVar8 + 1;
    pVVar7->pArray[iVar8] = 0.0;
    uVar2 = vFanouts->nSize;
    if (0 < (int)uVar2) {
      uVar11 = 2;
      if (2 < (int)(uint)uVar12) {
        uVar11 = (uint)uVar12;
      }
      if ((int)uVar2 <= (int)uVar11) {
        uVar11 = uVar2;
      }
      uVar12 = 0;
      do {
        if ((long)vFanouts->nSize <= (long)uVar12) goto LAB_004576d4;
        pObj_00 = (Abc_Obj_t *)vFanouts->pArray[uVar12];
        vFanouts->pArray[uVar12] = (void *)0x0;
        if ((pObj_00->vFanins).nSize == 0) {
          Abc_ObjAddFanin(pObj_00,pFanin);
        }
        else {
          Abc_ObjPatchFanin(pObj_00,pObj,pFanin);
        }
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    pSVar10 = Abc_SclFindSmallestGate(p->pInv,fVar17 / Gain);
    p_00 = p->pNtk->vGates;
    iVar8 = pFanin->Id;
    iVar3 = pSVar10->Id;
    Vec_IntFillExtra(p_00,iVar8 + 1,Fill);
    if (((long)iVar8 < 0) || (p_00->nSize <= iVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p_00->pArray[iVar8] = iVar3;
    Abc_NtkComputeNodeDeparture(pFanin,(float)p->pPars->Slew);
    fVar16 = Abc_NtkComputeNodeLoad(p,pFanin);
    if ((1.0 <= fVar16 - fVar17) || (1.0 <= fVar17 - fVar16)) {
      __assertion = "LoadNew - Load < 1 && Load - LoadNew < 1";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c";
      __function = "Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)";
      goto LAB_004576e9;
    }
    if (0 < (pSVar10->vPins).nSize) {
      iVar8 = pFanin->Id;
      if ((-1 < (long)iVar8) &&
         (lVar6 = *(long *)((long)pFanin->pNtk->pBSMan + 0x38), iVar8 < *(int *)(lVar6 + 4))) {
        pvVar4 = *(pSVar10->vPins).pArray;
        *(float *)(*(long *)(lVar6 + 8) + (long)iVar8 * 4) =
             *(float *)((long)pvVar4 + 0x10) * 0.5 + *(float *)((long)pvVar4 + 0x14) * 0.5;
        fVar16 = Abc_NtkComputeEdgeDept(pFanin,0,(float)p->pPars->Slew);
        iVar8 = pFanin->Id;
        if ((-1 < (long)iVar8) &&
           (lVar6 = *(long *)((long)pFanin->pNtk->pBSMan + 0x40), iVar8 < *(int *)(lVar6 + 4))) {
          *(float *)(*(long *)(lVar6 + 8) + (long)iVar8 * 4) = fVar16;
          if (p->pNtk->vPhases != (Vec_Int_t *)0x0) {
            iVar8 = Abc_SclIsInv(pFanin);
            if (iVar8 != 0) {
              Abc_NodeInvUpdateFanPolarity(pFanin);
            }
          }
          return pFanin;
        }
      }
      __assertion = "i >= 0 && i < p->nSize";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h";
      __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
      goto LAB_004576e9;
    }
  }
LAB_004576d4:
  __assertion = "i >= 0 && i < p->nSize";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h";
  __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_004576e9:
  __assert_fail(__assertion,__file,0x184,__function);
}

Assistant:

Abc_Obj_t * Abc_SclAddOneInv( Bus_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vFanouts, float Gain )
{
    SC_Cell * pCellNew;
    Abc_Obj_t * pFanout, * pInv;
    float Target = SC_CellPinCap(p->pInv, 0) * Gain;
    float LoadWirePrev, LoadWireThis, LoadNew, Load = 0;
    int Limit = Abc_MinInt( p->pPars->nDegree, Vec_PtrSize(vFanouts) );
    int i, iStop;
    Bus_SclCheckSortedFanout( vFanouts );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, iStop, Limit )
    {
        LoadWirePrev = Abc_SclFindWireLoad( p->vWireCaps, iStop );
        LoadWireThis = Abc_SclFindWireLoad( p->vWireCaps, iStop+1 );
        Load += Bus_SclObjCin( pFanout ) - LoadWirePrev + LoadWireThis;
        if ( Load > Target )
        {
            iStop++;
            break;
        }
    }
    // create inverter
    if ( p->pPars->fAddBufs )
        pInv = Abc_NtkCreateNodeBuf( p->pNtk, NULL );
    else
        pInv = Abc_NtkCreateNodeInv( p->pNtk, NULL );
    assert( (int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins) );
    Vec_FltPush( p->vCins,   0 );
    Vec_FltPush( p->vETimes, 0 );
    Vec_FltPush( p->vLoads,  0 );
    Vec_FltPush( p->vDepts,  0 );
    Limit = Abc_MinInt( Abc_MaxInt(iStop, 2), Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Limit )
    {
        Vec_PtrWriteEntry( vFanouts, i, NULL );
        if ( Abc_ObjFaninNum(pFanout) == 0 )
            Abc_ObjAddFanin( pFanout, pInv );
        else
            Abc_ObjPatchFanin( pFanout, pObj, pInv );
    }
    // set the gate
    pCellNew = Abc_SclFindSmallestGate( p->pInv, Load / Gain );
    Vec_IntSetEntry( p->pNtk->vGates, Abc_ObjId(pInv), pCellNew->Id );
    // set departure and load
    Abc_NtkComputeNodeDeparture( pInv, p->pPars->Slew );
    LoadNew = Abc_NtkComputeNodeLoad( p, pInv );
    assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
    // set fanout info for the inverter
    Bus_SclObjSetCin( pInv, SC_CellPinCap(pCellNew, 0) );
    Bus_SclObjSetETime( pInv, Abc_NtkComputeEdgeDept(pInv, 0, p->pPars->Slew) );
    // update phases
    if ( p->pNtk->vPhases && Abc_SclIsInv(pInv) )
        Abc_NodeInvUpdateFanPolarity( pInv );
    return pInv;
}